

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astFunctionApplicationNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t *environment_00;
  sysbvm_tuple_t sVar1;
  sysbvm_tuple_t sVar2;
  undefined1 local_c8 [8];
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_88_11_6f41371a gcFrame;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  environment_00 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x58);
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type =
       SYSBVM_STACK_FRAME_RECORD_TYPE_CLEANUP|
       SYSBVM_STACK_FRAME_RECORD_TYPE_BYTECODE_JIT_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  gcFrameRecord.roots = (sysbvm_tuple_t *)sysbvm_context_shallowCopy(context,*arguments);
  sVar1 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,*environment_00);
  gcFrameRecord.roots[3] = sVar1;
  local_c8 = (undefined1  [8])0x0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = gcFrameRecord.roots[2];
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)local_c8);
  sVar1 = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment
                    (context,gcFrameRecord.roots[5],*environment_00);
  gcFrameRecord.roots[5] = sVar1;
  sVar1 = sysbvm_astNode_getAnalyzedType(sVar1);
  sVar2 = sysbvm_tuple_getType(context,sVar1);
  sVar2 = sysbvm_type_getAnalyzeAndTypeCheckFunctionApplicationNodeWithEnvironment(context,sVar2);
  if (sVar2 == 0) {
    gcFrame.typeCheckFunction =
         sysbvm_astFunctionApplicationNode_defaultTypeCheck
                   (context,(sysbvm_astFunctionApplicationNode_t **)&gcFrameRecord.roots,
                    environment_00);
  }
  else {
    gcFrame.typeCheckFunction =
         sysbvm_function_apply3
                   (context,sVar2,sVar1,(sysbvm_tuple_t)gcFrameRecord.roots,*environment_00);
  }
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)local_c8);
  sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  return gcFrame.typeCheckFunction;
}

Assistant:

static sysbvm_tuple_t sysbvm_astFunctionApplicationNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astFunctionApplicationNode_t *applicationNode;
        sysbvm_tuple_t analyzedFunctionExpression;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t analyzedArgument;
        sysbvm_tuple_t analyzedArguments;
        
        sysbvm_tuple_t literalFunction;
        sysbvm_tuple_t pureCallResult;
        sysbvm_tuple_t argumentValue;
        sysbvm_tuple_t functionType;

        sysbvm_tuple_t typeCheckFunction;

        sysbvm_tuple_t result;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.applicationNode = (sysbvm_astFunctionApplicationNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.applicationNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);

    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.applicationNode->super.sourcePosition);

    gcFrame.analyzedFunctionExpression = sysbvm_interpreter_analyzeASTWithDecayedTypeWithEnvironment(context, gcFrame.applicationNode->functionExpression, *environment);
    gcFrame.applicationNode->functionExpression = gcFrame.analyzedFunctionExpression;
    gcFrame.functionType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedFunctionExpression);

    // Type check the function application.
    gcFrame.typeCheckFunction = sysbvm_type_getAnalyzeAndTypeCheckFunctionApplicationNodeWithEnvironment(context, sysbvm_tuple_getType(context, gcFrame.functionType));
    if(gcFrame.typeCheckFunction)
        gcFrame.result = sysbvm_function_apply3(context, gcFrame.typeCheckFunction, gcFrame.functionType, (sysbvm_tuple_t)gcFrame.applicationNode, *environment);
    else
        gcFrame.result = sysbvm_astFunctionApplicationNode_defaultTypeCheck(context, &gcFrame.applicationNode, environment);

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}